

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceVkImpl.cpp
# Opt level: O2

void __thiscall Diligent::FenceVkImpl::Reset(FenceVkImpl *this,Uint64 Value)

{
  char (*in_stack_ffffffffffffffb8) [2];
  Uint64 Value_local;
  string msg;
  
  Value_local = Value;
  if ((this->m_TimelineSemaphore).m_VkObject == (VkSemaphore_T *)0x0) {
    std::mutex::lock(&this->m_SyncPointsGuard);
    if (Value < (this->super_FenceBase<Diligent::EngineVkImplTraits>).m_LastCompletedFenceValue.
                super___atomic_base<unsigned_long>._M_i) {
      FormatString<char[18],char_const*,char[17],unsigned_long,char[50],std::atomic<unsigned_long>,char[2]>
                (&msg,(Diligent *)"Resetting fence \'",
                 (char (*) [18])
                 &(this->super_FenceBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                  .m_Desc,(char **)"\' to the value (",(char (*) [17])&Value_local,
                 (unsigned_long *)") that is smaller than the last completed value (",
                 (char (*) [50])
                 &(this->super_FenceBase<Diligent::EngineVkImplTraits>).m_LastCompletedFenceValue,
                 (atomic<unsigned_long> *)0x801c00,in_stack_ffffffffffffffb8);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"Reset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
                 ,0xbc);
      std::__cxx11::string::~string((string *)&msg);
    }
    FenceBase<Diligent::EngineVkImplTraits>::UpdateLastCompletedFenceValue
              (&this->super_FenceBase<Diligent::EngineVkImplTraits>,Value_local);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_SyncPointsGuard);
  }
  else {
    FormatString<char[48]>(&msg,(char (*) [48])"Reset() is not supported for timeline semaphore");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Reset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
               ,0xb6);
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

void FenceVkImpl::Reset(Uint64 Value)
{
    if (IsTimelineSemaphore())
    {
        DEV_ERROR("Reset() is not supported for timeline semaphore");
    }
    else
    {
        std::lock_guard<std::mutex> Lock{m_SyncPointsGuard};

        DEV_CHECK_ERR(Value >= m_LastCompletedFenceValue.load(), "Resetting fence '", m_Desc.Name, "' to the value (", Value, ") that is smaller than the last completed value (", m_LastCompletedFenceValue, ")");
        UpdateLastCompletedFenceValue(Value);
    }
}